

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListModel.cpp
# Opt level: O3

QVariant * __thiscall
QColorListModel::data
          (QVariant *__return_storage_ptr__,QColorListModel *this,QModelIndex *index,int role)

{
  long lVar1;
  undefined1 auStack_48 [16];
  QArrayDataPointer<char16_t> local_38;
  QSize local_20;
  
  lVar1 = (long)index->r;
  if ((-1 < lVar1) && (lVar1 < (this->d->colors).d.size)) {
    if (role == 1) {
      QColor::setNamedColor((QString *)(auStack_48 + 0x10));
      local_20.wd = 0x40;
      local_20.ht = 0x40;
      QtWidgetsExtraCache::cachedIconColor
                ((QtWidgetsExtraCache *)auStack_48,(QColor *)(auStack_48 + 0x10),&local_20);
      QIcon::operator_cast_to_QVariant(__return_storage_ptr__,(QIcon *)auStack_48);
      QIcon::~QIcon((QIcon *)auStack_48);
      return __return_storage_ptr__;
    }
    if ((role & 0xfffffffdU) == 0) {
      QColor::setNamedColor((QString *)auStack_48);
      QColor::name((NameFormat)(QString *)(auStack_48 + 0x10));
      QVariant::QVariant(__return_storage_ptr__,(QString *)(auStack_48 + 0x10));
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)(auStack_48 + 0x10));
      return __return_storage_ptr__;
    }
    if (role == 0x100) {
      QVariant::QVariant(__return_storage_ptr__,(this->d->colors).d.ptr + lVar1);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  return __return_storage_ptr__;
}

Assistant:

QVariant QColorListModel::data(const QModelIndex &index, int role) const {
    if (index.row() < 0 || index.row() >= d->colors.size()) {
        return QVariant();
    }

    if (role == Qt::DecorationRole) {
        return QtWidgetsExtraCache::cachedIconColor(QColor(d->colors.at(index.row())), QSize(64, 64));
    } else if (role == Qt::DisplayRole || role == Qt::EditRole) {
        return QColor(d->colors.at(index.row())).name(QColor::NameFormat(d->nameFormat));
    } else if (role == static_cast<int>(QColorListModel::Role::HexArgbName)) {
        return d->colors.at(index.row());
    }

    return QVariant();
}